

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::argument_loader<SequenceDistanceGraph*,std::__cxx11::string,bool>::
load_impl_sequence<0ul,1ul,2ul>(void *param_1,long param_2)

{
  handle src;
  reference pvVar1;
  initializer_list<bool> *this;
  const_iterator pbVar2;
  const_iterator pbVar3;
  bool r;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<bool> *__range3;
  undefined8 in_stack_ffffffffffffff50;
  undefined1 convert;
  handle in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff70;
  handle in_stack_ffffffffffffff78;
  reference local_80;
  PyObject *local_70;
  reference local_68;
  PyObject *local_58;
  reference local_50;
  PyObject *local_40;
  bool local_33;
  undefined1 local_32;
  undefined1 local_31;
  initializer_list<bool> local_30;
  initializer_list<bool> *local_20;
  string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *this_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  convert = (undefined1)((ulong)in_stack_ffffffffffffff50 >> 0x38);
  this_00 = (string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             *)param_1;
  std::
  get<0ul,pybind11::detail::type_caster<SequenceDistanceGraph,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<bool,void>>
            ((tuple<pybind11::detail::type_caster<SequenceDistanceGraph,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_pybind11::detail::type_caster<bool,_void>_>
              *)0x3e0ff9);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(param_2 + 8),0
                     );
  local_40 = pvVar1->m_ptr;
  local_50 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_ffffffffffffff70,
                        CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  std::_Bit_reference::operator_cast_to_bool(&local_50);
  local_33 = type_caster_generic::load
                       ((type_caster_generic *)param_1,in_stack_ffffffffffffff60,(bool)convert);
  this = (initializer_list<bool> *)
         std::
         get<1ul,pybind11::detail::type_caster<SequenceDistanceGraph,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<bool,void>>
                   ((tuple<pybind11::detail::type_caster<SequenceDistanceGraph,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_pybind11::detail::type_caster<bool,_void>_>
                     *)0x3e106a);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(param_2 + 8),1
                     );
  local_58 = pvVar1->m_ptr;
  local_68 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_ffffffffffffff70,
                        CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  std::_Bit_reference::operator_cast_to_bool(&local_68);
  src.m_ptr._7_1_ = in_stack_ffffffffffffffff;
  src.m_ptr._0_7_ = in_stack_fffffffffffffff8;
  local_32 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ::load(this_00,src,SUB81((ulong)param_2 >> 0x38,0));
  std::
  get<2ul,pybind11::detail::type_caster<SequenceDistanceGraph,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<bool,void>>
            ((tuple<pybind11::detail::type_caster<SequenceDistanceGraph,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_pybind11::detail::type_caster<bool,_void>_>
              *)0x3e10df);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(param_2 + 8),2
                     );
  local_70 = pvVar1->m_ptr;
  local_80 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_ffffffffffffff70,
                        CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  std::_Bit_reference::operator_cast_to_bool(&local_80);
  local_31 = type_caster<bool,_void>::load
                       ((type_caster<bool,_void> *)in_stack_ffffffffffffff70,
                        in_stack_ffffffffffffff78,(bool)in_stack_ffffffffffffff6f);
  local_30._M_array = &local_33;
  local_30._M_len = 3;
  local_20 = &local_30;
  pbVar2 = std::initializer_list<bool>::begin(local_20);
  pbVar3 = std::initializer_list<bool>::end(this);
  while( true ) {
    if (pbVar2 == pbVar3) {
      return true;
    }
    if ((*pbVar2 & 1U) == 0) break;
    pbVar2 = pbVar2 + 1;
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }